

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O0

bool __thiscall mcsFile::toHex(mcsFile *this,char *p2,uchar *result)

{
  int iVar1;
  uint local_34;
  byte abStack_2e [2];
  uint i;
  uchar digit [2];
  byte *pbStack_28;
  uint NUM_DIGITS;
  uchar *result_local;
  char *p2_local;
  mcsFile *this_local;
  
  pbStack_28 = result;
  i = 2;
  *result = '\0';
  local_34 = 0;
  do {
    if (1 < local_34) {
      return true;
    }
    abStack_2e[local_34] = p2[local_34] - 0x30;
    if (9 < abStack_2e[local_34]) {
      iVar1 = toupper((int)p2[local_34]);
      abStack_2e[local_34] = (char)iVar1 + 0xbf;
      if (5 < abStack_2e[local_34]) {
        return false;
      }
      abStack_2e[local_34] = abStack_2e[local_34] + 10;
    }
    *pbStack_28 = *pbStack_28 | abStack_2e[local_34] << (('\x01' - (char)local_34) * '\x04' & 0x1fU)
    ;
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

bool mcsFile::toHex(const char *p2, unsigned char &result) const
{
    const unsigned int NUM_DIGITS = 2;
    unsigned char digit[NUM_DIGITS];
    result = 0;
    for (unsigned int i = 0; i < NUM_DIGITS; i++) {
        digit[i] = p2[i]-'0';
        if (digit[i] > 9) {
            digit[i] = toupper(p2[i])-'A';
            if (digit[i] > 5) return false;
            digit[i] += 10;
        }
        result |= digit[i] << (4*(NUM_DIGITS-i-1));
    }
    return true;
}